

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall
presolve::HPresolve::checkFillin
          (HPresolve *this,HighsHashTable<int,_int> *fillinCache,HighsInt row,HighsInt col)

{
  int iVar1;
  HighsInt HVar2;
  reference pvVar3;
  ValueType *pVVar4;
  int in_ECX;
  int in_EDX;
  KeyType_conflict *in_RDI;
  HighsInt rowfillin;
  HighsInt *cachedFillin_1;
  HighsInt coliter_1;
  ValueType *cachedFillin;
  HighsInt coliter;
  HighsInt fillin;
  KeyType_conflict *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  value_type row_00;
  HPresolve *in_stack_ffffffffffffffd0;
  int local_28;
  int local_24;
  KeyType_conflict *key;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  key = in_RDI;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)in_EDX);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),(long)in_ECX);
  local_24 = -(iVar1 + *pvVar3 + -1);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),(long)in_ECX);
  local_28 = *pvVar3;
  do {
    if (local_28 == -1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c),(long)in_ECX);
      row_00 = *pvVar3;
      do {
        if (row_00 == -1) {
          return true;
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)row_00);
        if (*pvVar3 != in_EDX) {
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)row_00);
          pVVar4 = HighsHashTable<int,_int>::operator[]
                             ((HighsHashTable<int,_int> *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),key);
          if (*pVVar4 == 0) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)row_00);
            HVar2 = countFillin(in_stack_ffffffffffffffd0,row_00);
            *pVVar4 = HVar2 + 1;
            local_24 = HVar2 + local_24;
            if (*(int *)(*(long *)(in_RDI + 2) + 0x248) < local_24) {
              return false;
            }
          }
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x22),(long)row_00);
        row_00 = *pvVar3;
      } while( true );
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_28);
    if (*pvVar3 != in_EDX) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_28);
      in_stack_ffffffffffffffd0 =
           (HPresolve *)
           HighsHashTable<int,_int>::find
                     ((HighsHashTable<int,_int> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
      if ((in_stack_ffffffffffffffd0 != (HPresolve *)0x0) &&
         (local_24 = *(int *)&in_stack_ffffffffffffffd0->model + -1 + local_24,
         *(int *)(*(long *)(in_RDI + 2) + 0x248) < local_24)) {
        return false;
      }
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x22),(long)local_28);
    local_28 = *pvVar3;
  } while( true );
}

Assistant:

bool HPresolve::checkFillin(HighsHashTable<HighsInt, HighsInt>& fillinCache,
                            HighsInt row, HighsInt col) {
  // check numerics against markowitz tolerance
  assert(rowpositions.size() == static_cast<size_t>(rowsize[row]));

  // check fillin against max fillin
  HighsInt fillin = -(rowsize[row] + colsize[col] - 1);

#if 1
  // first use fillin for rows where it is already computed
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    if (Arow[coliter] == row) continue;

    auto cachedFillin = fillinCache.find(Arow[coliter]);
    if (cachedFillin == nullptr) continue;

    fillin += (*cachedFillin - 1);
    if (fillin > options->presolve_substitution_maxfillin) return false;
  }

  // iterate over rows of substituted column again to count the fillin for the
  // remaining rows
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    assert(Acol[coliter] == col);

    if (Arow[coliter] == row) continue;

    HighsInt& cachedFillin = fillinCache[Arow[coliter]];

    if (cachedFillin != 0) continue;

    HighsInt rowfillin = countFillin(Arow[coliter]);
    cachedFillin = rowfillin + 1;
    fillin += rowfillin;

    if (fillin > options->presolve_substitution_maxfillin) return false;
    // we count a fillin of 1 if the column is not present in the row and
    // a fillin of zero otherwise. the fillin for the substituted column
    // itself was already counted before the loop so we skip that entry.
  }
#else
  for (HighsInt rowiter : rowpositions) {
    if (rowiter == pos) continue;
    for (coliter = colhead[col]; coliter != -1; coliter = Anext[coliter]) {
      assert(Acol[coliter] == col);

      if (rowiter != coliter &&
          findNonzero(Arow[coliter], Acol[rowiter]) == -1) {
        if (fillin == maxfillin) return false;
        fillin += 1;
      }
    }
  }
#endif

  return true;
}